

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_0::PolysTestGroup::init
          (PolysTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  undefined1 *viewport;
  Vector<float,_4> local_868;
  Vector<float,_4> local_858;
  Vector<float,_4> local_848;
  TriangleData local_838;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  Vector<float,_4> local_7c8;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  Vector<float,_4> local_7a8;
  undefined8 local_798;
  undefined8 uStack_790;
  Vector<float,_4> local_788;
  undefined8 local_778;
  undefined8 uStack_770;
  Vector<float,_4> local_768;
  undefined8 local_758;
  undefined8 uStack_750;
  Vector<float,_4> local_748;
  undefined8 local_738;
  undefined8 uStack_730;
  Vector<float,_4> local_728;
  undefined1 local_718 [64];
  float local_6d8 [4];
  Vector<float,_4> local_6c8;
  undefined1 local_6b8 [64];
  float local_678 [4];
  Vector<float,_4> local_668;
  undefined1 local_658 [64];
  float local_618 [4];
  Vector<float,_4> local_608;
  TriangleData local_5f8;
  undefined1 local_598 [40];
  float afStack_570 [2];
  Vector<float,_4> local_568;
  float local_558 [4];
  Vector<float,_4> local_548;
  undefined8 local_538;
  undefined8 uStack_530;
  Vector<float,_4> local_528;
  undefined1 *local_518;
  undefined8 uStack_510;
  Vector<float,_4> local_508;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  Vector<float,_4> local_4e8;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  Vector<float,_4> local_4c8;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  Vector<float,_4> local_4a8;
  undefined8 local_498;
  undefined8 uStack_490;
  Vector<float,_4> local_488;
  undefined8 local_478;
  undefined8 uStack_470;
  Vector<float,_4> VStack_468;
  TriangleData local_458;
  undefined1 *local_3f8;
  undefined8 uStack_3f0;
  Vector<float,_4> local_3e8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  Vector<float,_4> local_3c8;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  Vector<float,_4> local_3a8;
  undefined8 local_398;
  undefined8 uStack_390;
  Vector<float,_4> local_388;
  undefined8 local_378;
  undefined8 uStack_370;
  Vector<float,_4> local_368;
  undefined8 local_358;
  undefined8 uStack_350;
  Vector<float,_4> VStack_348;
  TriangleData local_338;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  Vector<float,_4> local_2c8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  Vector<float,_4> VStack_2a8;
  undefined8 local_298;
  undefined8 uStack_290;
  Vector<float,_4> VStack_288;
  undefined8 local_278;
  undefined8 uStack_270;
  Vector<float,_4> VStack_268;
  undefined8 local_258;
  undefined8 uStack_250;
  Vector<float,_4> VStack_248;
  tcu local_238 [16];
  Vector<float,_4> VStack_228;
  undefined8 local_218;
  undefined8 uStack_210;
  Vector<float,_4> VStack_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  Vector<float,_4> VStack_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  Vector<float,_4> VStack_1c8;
  TriangleData local_1b8;
  undefined8 local_158;
  undefined8 uStack_150;
  Vector<float,_4> local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  Vector<float,_4> local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  Vector<float,_4> local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  Vector<float,_4> local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Vector<float,_4> local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Vector<float,_4> local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  Vector<float,_4> local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  Vector<float,_4> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  Vector<float,_4> VStack_48;
  
  local_598._0_4_ = 1.0;
  local_598._4_4_ = 1.0;
  local_598._8_4_ = 1.0;
  local_598._12_4_ = 1.0;
  local_868.m_data[0] = 1.0;
  local_868.m_data[1] = 0.0;
  local_868.m_data[2] = 0.0;
  local_868.m_data[3] = 1.0;
  local_848.m_data[0] = 1.0;
  local_848.m_data[1] = 1.0;
  local_848.m_data[2] = 0.0;
  local_848.m_data[3] = 1.0;
  local_858.m_data[0] = 0.0;
  local_858.m_data[1] = 0.0;
  local_858.m_data[2] = 1.0;
  local_858.m_data[3] = 1.0;
  local_838.p0.m_data[0] = -0.8;
  local_838.p0.m_data[1] = -0.2;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,(Vector<float,_4> *)local_598);
  local_838.p1.m_data[0] = -0.8;
  local_838.p1.m_data[1] = 0.2;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,(Vector<float,_4> *)local_598);
  local_838.p2.m_data[0] = -1.3;
  local_838.p2.m_data[1] = 0.05;
  local_838.p2.m_data[2] = 0.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,(Vector<float,_4> *)local_598);
  local_7d8 = 0xbf99999abf19999a;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,(Vector<float,_4> *)local_598);
  local_7b8 = 0xbf19999abf99999a;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,(Vector<float,_4> *)local_598);
  local_798 = 0xbf19999abf19999a;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,(Vector<float,_4> *)local_598);
  local_778 = 0x3f19999abf8ccccd;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,(Vector<float,_4> *)local_598);
  local_758 = 0x3f8ccccdbf8ccccd;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,(Vector<float,_4> *)local_598);
  local_738 = 0x3f8ccccdbf19999a;
  uStack_730 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_728,(Vector<float,_4> *)local_598);
  local_718._0_4_ = 0.8;
  local_718._4_4_ = 1.1;
  local_718._8_4_ = 0.0;
  local_718._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(local_718 + 0x10),(Vector<float,_4> *)local_598);
  local_718._32_4_ = 0.95;
  local_718._36_4_ = -1.1;
  local_718._40_4_ = 0.0;
  local_718._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(local_718 + 0x30),(Vector<float,_4> *)local_598);
  local_6d8[0] = 3.0;
  local_6d8[1] = 0.0;
  local_6d8[2] = 0.0;
  local_6d8[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_6c8,(Vector<float,_4> *)local_598);
  local_1b8.p0.m_data[0] = -0.2;
  local_1b8.p0.m_data[1] = 0.7;
  local_1b8.p0.m_data[2] = 0.0;
  local_1b8.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_1b8.c0,(Vector<float,_4> *)local_598);
  local_1b8.p1.m_data[0] = 0.2;
  local_1b8.p1.m_data[1] = 0.7;
  local_1b8.p1.m_data[2] = 0.0;
  local_1b8.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_1b8.c1,(Vector<float,_4> *)local_598);
  local_1b8.p2.m_data[0] = 0.0;
  local_1b8.p2.m_data[1] = 0.9;
  local_1b8.p2.m_data[2] = 2.0;
  local_1b8.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_1b8.c2,(Vector<float,_4> *)local_598);
  local_158 = 0x3ecccccd3f666666;
  uStack_150 = 0x3f800000bfc00000;
  tcu::Vector<float,_4>::Vector(&local_148,(Vector<float,_4> *)local_598);
  local_138 = 0xbecccccd3f666666;
  uStack_130 = 0x3f800000bfc00000;
  tcu::Vector<float,_4>::Vector(&local_128,(Vector<float,_4> *)local_598);
  local_118 = 0x3f19999a;
  uStack_110 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_108,(Vector<float,_4> *)local_598);
  local_f8 = 0x3f19999abf666666;
  uStack_f0 = 0x3f800000c0000000;
  tcu::Vector<float,_4>::Vector(&local_e8,(Vector<float,_4> *)local_598);
  local_d8 = 0xbf19999abf666666;
  uStack_d0 = 0x3f800000c0000000;
  tcu::Vector<float,_4>::Vector(&local_c8,(Vector<float,_4> *)local_598);
  local_b8 = 0xbecccccd;
  uStack_b0 = 0x3f80000040000000;
  tcu::Vector<float,_4>::Vector(&local_a8,(Vector<float,_4> *)local_598);
  local_98 = 0xbf99999a00000000;
  uStack_90 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_88,(Vector<float,_4> *)local_598);
  local_78 = 0x3f00000000000000;
  uStack_70 = 0x3f800000bfc00000;
  tcu::Vector<float,_4>::Vector(&local_68,(Vector<float,_4> *)local_598);
  local_58 = 0xbf6666663f99999a;
  uStack_50 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&VStack_48,(Vector<float,_4> *)local_598);
  local_458.p0.m_data[0] = -0.2;
  local_458.p0.m_data[1] = -0.3;
  local_458.p0.m_data[2] = 0.0;
  local_458.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_458.c0,(Vector<float,_4> *)local_598);
  local_458.p1.m_data[0] = 0.2;
  local_458.p1.m_data[1] = -0.3;
  local_458.p1.m_data[2] = 0.0;
  local_458.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_458.c1,(Vector<float,_4> *)local_598);
  local_458.p2.m_data[0] = 0.0;
  local_458.p2.m_data[1] = -100000.0;
  local_458.p2.m_data[2] = 2.0;
  local_458.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_458.c2,(Vector<float,_4> *)local_598);
  local_3f8 = &DAT_3f0000003f000000;
  uStack_3f0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_3e8,(Vector<float,_4> *)local_598);
  local_3d8 = 0x3f00000047c35000;
  uStack_3d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_3c8,(Vector<float,_4> *)local_598);
  local_3b8 = 0x47c350003f000000;
  uStack_3b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_3a8,(Vector<float,_4> *)local_598);
  local_398 = 0xc7c35000bf666666;
  uStack_390 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_388,(Vector<float,_4> *)local_598);
  local_378 = 0xc7c35000bf8ccccd;
  uStack_370 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_368,(Vector<float,_4> *)local_598);
  local_358 = 0x47c35000bf666666;
  uStack_350 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&VStack_348,(Vector<float,_4> *)local_598);
  local_598._32_4_ = -0.2;
  local_598._36_4_ = -0.3;
  afStack_570[0] = 0.0;
  afStack_570[1] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_568,(Vector<float,_4> *)local_598);
  local_558[0] = 0.2;
  local_558[1] = -0.3;
  local_558[2] = 0.0;
  local_558[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_548,(Vector<float,_4> *)local_598);
  local_538 = 0xc7c3500000000000;
  uStack_530 = 0x3f80000047c35000;
  tcu::Vector<float,_4>::Vector(&local_528,(Vector<float,_4> *)local_598);
  local_518 = &DAT_3f0000003f000000;
  uStack_510 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_508,(Vector<float,_4> *)local_598);
  local_4f8 = 0x474350003f666666;
  uStack_4f0 = 0x3f800000c7c35000;
  tcu::Vector<float,_4>::Vector(&local_4e8,(Vector<float,_4> *)local_598);
  local_4d8 = 0x46c35000;
  uStack_4d0 = 0x3f800000c7c35000;
  tcu::Vector<float,_4>::Vector(&local_4c8,(Vector<float,_4> *)local_598);
  local_4b8 = 0x46c35000bf666666;
  uStack_4b0 = 0x3f80000047c35000;
  tcu::Vector<float,_4>::Vector(&local_4a8,(Vector<float,_4> *)local_598);
  local_498 = 0xc6c35000bf000000;
  uStack_490 = 0x3f800000c7c35000;
  tcu::Vector<float,_4>::Vector(&local_488,(Vector<float,_4> *)local_598);
  local_478 = 0x46c35000be4ccccd;
  uStack_470 = 0x3f80000047c35000;
  tcu::Vector<float,_4>::Vector(&VStack_468,(Vector<float,_4> *)local_598);
  local_338.p0.m_data[0] = -0.2;
  local_338.p0.m_data[1] = -0.3;
  local_338.p0.m_data[2] = 0.0;
  local_338.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_338.c0,&local_868);
  local_338.p1.m_data[0] = 0.2;
  local_338.p1.m_data[1] = -0.3;
  local_338.p1.m_data[2] = 0.0;
  local_338.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_338.c1,&local_848);
  local_338.p2.m_data[0] = 0.0;
  local_338.p2.m_data[1] = -100000.0;
  local_338.p2.m_data[2] = 2.0;
  local_338.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_338.c2,&local_858);
  local_2d8 = 0x3f99999a3f19999a;
  uStack_2d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_2c8,&local_868);
  local_2b8 = 0x3f19999a3f99999a;
  uStack_2b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&VStack_2a8,&local_848);
  local_298 = 0x3f19999a3f19999a;
  uStack_290 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&VStack_288,&local_858);
  local_278 = 0xbf99999a3f19999a;
  uStack_270 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&VStack_268,&local_868);
  local_258 = 0xbf19999a3f99999a;
  uStack_250 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&VStack_248,&local_848);
  local_598._16_4_ = 0.6;
  local_598._20_4_ = -0.6;
  local_598._24_4_ = 0.0;
  local_598._28_4_ = 1.0;
  tcu::operator*(local_238,16.0,(Vector<float,_4> *)(local_598 + 0x10));
  tcu::Vector<float,_4>::Vector(&VStack_228,&local_858);
  local_218 = 0x46c35000bf666666;
  uStack_210 = 0x3f80000047c35000;
  tcu::Vector<float,_4>::Vector(&VStack_208,&local_868);
  local_1f8 = 0xc6c35000bf000000;
  uStack_1f0 = 0x3f800000c7c35000;
  tcu::Vector<float,_4>::Vector(&VStack_1e8,&local_848);
  local_1d8 = 0x46c35000be4ccccd;
  uStack_1d0 = 0x3f80000047c35000;
  tcu::Vector<float,_4>::Vector(&VStack_1c8,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "poly_clip_viewport_center","polygon viewport clipping",&local_838,
             (TriangleData *)local_6b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "poly_clip_viewport_corner","polygon viewport clipping",&local_838,
             (TriangleData *)local_6b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar1,(this->super_TestCaseGroup).m_context,"poly_z_clip",
             "polygon z clipping",&local_1b8,(TriangleData *)&stack0xffffffffffffffc8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "poly_z_clip_viewport_center","polygon z clipping",&local_1b8,
             (TriangleData *)&stack0xffffffffffffffc8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "poly_z_clip_viewport_corner","polygon z clipping",&local_1b8,
             (TriangleData *)&stack0xffffffffffffffc8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "large_poly_clip_viewport_center","polygon viewport clipping",&local_458,&local_338,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "large_poly_clip_viewport_corner","polygon viewport clipping",&local_458,&local_338,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar1,(this->super_TestCaseGroup).m_context,"large_poly_z_clip",
             "polygon z clipping",(TriangleData *)(local_598 + 0x20),&local_458,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "large_poly_z_clip_viewport_center","polygon z clipping",
             (TriangleData *)(local_598 + 0x20),&local_458,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  viewport = Functional::(anonymous_namespace)::VIEWPORT_CORNER;
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "large_poly_z_clip_viewport_corner","polygon z clipping",
             (TriangleData *)(local_598 + 0x20),&local_458,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "poly_attrib_clip",(char *)&local_338,&local_1b8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "poly_attrib_clip_viewport_center",(char *)&local_338,&local_1b8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "poly_attrib_clip_viewport_corner",(char *)&local_338,&local_1b8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = -0.2;
  local_838.p0.m_data[1] = -0.3;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = 0.2;
  local_838.p1.m_data[1] = -0.3;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = 0.0;
  local_838.p2.m_data[1] = -0.9;
  local_838.p2.m_data[2] = 2.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0x3f99999a3f19999a;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,&local_868);
  local_7b8 = 0x3f19999a3f99999a;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,&local_848);
  local_798 = 0x3f19999a3f19999a;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,&local_858);
  local_778 = 0xbf99999a3f19999a;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_868);
  local_758 = 0xbf19999a3f99999a;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_848);
  local_1b8.p0.m_data[0] = 0.6;
  local_1b8.p0.m_data[1] = -0.6;
  local_1b8.p0.m_data[2] = 0.0;
  local_1b8.p0.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_738,16.0,&local_1b8.p0);
  tcu::Vector<float,_4>::Vector(&local_728,&local_858);
  local_718._0_4_ = 0.6;
  local_718._4_4_ = 1.2;
  local_718._8_4_ = 0.0;
  local_718._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x10),&local_868);
  local_718._32_4_ = 1.2;
  local_718._36_4_ = 0.6;
  local_718._40_4_ = 0.0;
  local_718._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x30),&local_848);
  local_338.p0.m_data[0] = 0.6;
  local_338.p0.m_data[1] = 0.6;
  local_338.p0.m_data[2] = 0.0;
  local_338.p0.m_data[3] = 1.0;
  tcu::operator*((tcu *)local_6d8,16.0,&local_338.p0);
  tcu::Vector<float,_4>::Vector(&local_6c8,&local_858);
  local_6b8._0_4_ = -0.6;
  local_6b8._4_4_ = 1.2;
  local_6b8._8_4_ = 0.0;
  local_6b8._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x10),&local_868);
  local_6b8._32_4_ = -1.2;
  local_6b8._36_4_ = 0.6;
  local_6b8._40_4_ = 0.0;
  local_6b8._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x30),&local_848);
  local_458.p0.m_data[0] = -0.6;
  local_458.p0.m_data[1] = 0.6;
  local_458.p0.m_data[2] = 0.0;
  local_458.p0.m_data[3] = 1.0;
  tcu::operator*((tcu *)local_678,16.0,&local_458.p0);
  tcu::Vector<float,_4>::Vector(&local_668,&local_858);
  local_658._0_4_ = -0.6;
  local_658._4_4_ = -1.2;
  local_658._8_4_ = 0.0;
  local_658._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_658 + 0x10),&local_868);
  local_658._32_4_ = -1.2;
  local_658._36_4_ = -0.6;
  local_658._40_4_ = 0.0;
  local_658._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_658 + 0x30),&local_848);
  local_598._32_4_ = -0.6;
  local_598._36_4_ = -0.6;
  afStack_570[0] = 0.0;
  afStack_570[1] = 1.0;
  tcu::operator*((tcu *)local_618,16.0,(Vector<float,_4> *)(local_598 + 0x20));
  tcu::Vector<float,_4>::Vector(&local_608,&local_858);
  local_5f8.p0.m_data[0] = -0.9;
  local_5f8.p0.m_data[1] = 0.225;
  local_5f8.p0.m_data[2] = 0.9;
  local_5f8.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_5f8.c0,&local_868);
  local_5f8.p1.m_data[0] = -0.5;
  local_5f8.p1.m_data[1] = -0.225;
  local_5f8.p1.m_data[2] = -0.9;
  local_5f8.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_5f8.c1,&local_848);
  local_5f8.p2.m_data[0] = -0.2;
  local_5f8.p2.m_data[1] = 0.225;
  local_5f8.p2.m_data[2] = 0.9;
  local_5f8.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_5f8.c2,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_0",
             (char *)&local_838,(TriangleData *)local_598,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_0_viewport_center",(char *)&local_838,(TriangleData *)local_598,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_0_viewport_corner",(char *)&local_838,(TriangleData *)local_598,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = -0.2;
  local_838.p0.m_data[1] = -0.3;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = 0.2;
  local_838.p1.m_data[1] = -0.3;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = 0.0;
  local_838.p2.m_data[1] = -0.9;
  local_838.p2.m_data[2] = 2.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0x3f99999a3f19999a;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,&local_868);
  local_7b8 = 0x3f19999a3f99999a;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,&local_848);
  local_798 = 0x3f19999a3f19999a;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,&local_858);
  local_778 = 0xbf99999a3f19999a;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_868);
  local_758 = 0xbf19999a3f99999a;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_848);
  local_1b8.p0.m_data[0] = 0.6;
  local_1b8.p0.m_data[1] = -0.6;
  local_1b8.p0.m_data[2] = 0.0;
  local_1b8.p0.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_738,16.0,&local_1b8.p0);
  tcu::Vector<float,_4>::Vector(&local_728,&local_858);
  local_718._0_4_ = 0.6;
  local_718._4_4_ = 1.2;
  local_718._8_4_ = 0.0;
  local_718._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x10),&local_868);
  local_718._32_4_ = 1.2;
  local_718._36_4_ = 0.6;
  local_718._40_4_ = 0.0;
  local_718._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x30),&local_848);
  local_338.p0.m_data[0] = 0.6;
  local_338.p0.m_data[1] = 0.6;
  local_338.p0.m_data[2] = 0.0;
  local_338.p0.m_data[3] = 1.0;
  tcu::operator*((tcu *)local_6d8,16.0,&local_338.p0);
  tcu::Vector<float,_4>::Vector(&local_6c8,&local_858);
  local_6b8._0_4_ = -0.6;
  local_6b8._4_4_ = 1.2;
  local_6b8._8_4_ = 0.0;
  local_6b8._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x10),&local_868);
  local_6b8._32_4_ = -1.2;
  local_6b8._36_4_ = 0.6;
  local_6b8._40_4_ = 0.0;
  local_6b8._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x30),&local_848);
  local_458.p0.m_data[0] = -0.6;
  local_458.p0.m_data[1] = 0.6;
  local_458.p0.m_data[2] = 0.0;
  local_458.p0.m_data[3] = 1.0;
  tcu::operator*((tcu *)local_678,16.0,&local_458.p0);
  tcu::Vector<float,_4>::Vector(&local_668,&local_858);
  local_658._0_4_ = -0.6;
  local_658._4_4_ = -1.2;
  local_658._8_4_ = 0.0;
  local_658._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_658 + 0x10),&local_868);
  local_658._32_4_ = -1.2;
  local_658._36_4_ = -0.6;
  local_658._40_4_ = 0.0;
  local_658._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_658 + 0x30),&local_848);
  local_598._32_4_ = -0.6;
  local_598._36_4_ = -0.6;
  afStack_570[0] = 0.0;
  afStack_570[1] = 1.0;
  tcu::operator*((tcu *)local_618,16.0,(Vector<float,_4> *)(local_598 + 0x20));
  tcu::Vector<float,_4>::Vector(&local_608,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_1",
             (char *)&local_838,&local_5f8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_1_viewport_center",(char *)&local_838,&local_5f8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_1_viewport_corner",(char *)&local_838,&local_5f8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = -0.2;
  local_838.p0.m_data[1] = -0.3;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = 0.2;
  local_838.p1.m_data[1] = -0.3;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = 0.0;
  local_838.p2.m_data[1] = -0.9;
  local_838.p2.m_data[2] = 2.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0x3f99999a3f19999a;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,&local_868);
  local_7b8 = 0x3f19999a3f99999a;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,&local_848);
  local_798 = 0x3f19999a3f19999a;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,&local_858);
  local_778 = 0xbf99999a3f19999a;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_868);
  local_758 = 0xbf19999a3f99999a;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_848);
  local_738 = 0xbf19999a3f19999a;
  uStack_730 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_728,&local_858);
  local_718._0_4_ = 0.6;
  local_718._4_4_ = 1.2;
  local_718._8_4_ = 0.0;
  local_718._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x10),&local_868);
  local_718._32_4_ = 1.2;
  local_718._36_4_ = 0.6;
  local_718._40_4_ = 0.0;
  local_718._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x30),&local_848);
  local_6d8[0] = 0.6;
  local_6d8[1] = 0.6;
  local_6d8[2] = 0.0;
  local_6d8[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_6c8,&local_858);
  local_6b8._0_4_ = -0.6;
  local_6b8._4_4_ = 1.2;
  local_6b8._8_4_ = 0.0;
  local_6b8._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x10),&local_868);
  local_6b8._32_4_ = -1.2;
  local_6b8._36_4_ = 0.6;
  local_6b8._40_4_ = 0.0;
  local_6b8._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x30),&local_848);
  local_678[0] = -0.6;
  local_678[1] = 0.6;
  local_678[2] = 0.0;
  local_678[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_668,&local_858);
  local_658._0_4_ = -0.6;
  local_658._4_4_ = -1.2;
  local_658._8_4_ = 0.0;
  local_658._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_658 + 0x10),&local_868);
  local_658._32_4_ = -1.2;
  local_658._36_4_ = -0.6;
  local_658._40_4_ = 0.0;
  local_658._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_658 + 0x30),&local_848);
  local_618[0] = -0.6;
  local_618[1] = -0.6;
  local_618[2] = 0.0;
  local_618[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_608,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_2",
             (char *)&local_838,&local_5f8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_2_viewport_center",(char *)&local_838,&local_5f8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_2_viewport_corner",(char *)&local_838,&local_5f8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = -0.2;
  local_838.p0.m_data[1] = -0.3;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = 0.2;
  local_838.p1.m_data[1] = -0.3;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = 0.0;
  local_838.p2.m_data[1] = -0.9;
  local_838.p2.m_data[2] = -2.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0xbf99999a3f19999a;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,&local_868);
  local_7b8 = 0xbf19999a3f99999a;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,&local_848);
  local_798 = 0xbf19999a3f19999a;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,&local_858);
  local_778 = 0x3f99999a3f19999a;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_868);
  local_758 = 0x3f19999a3f99999a;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_848);
  local_738 = 0x3f19999a3f19999a;
  uStack_730 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_728,&local_858);
  local_718._0_4_ = -0.6;
  local_718._4_4_ = 1.2;
  local_718._8_4_ = 0.0;
  local_718._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x10),&local_868);
  local_718._32_4_ = -1.2;
  local_718._36_4_ = 0.6;
  local_718._40_4_ = 0.0;
  local_718._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x30),&local_848);
  local_6d8[0] = -0.6;
  local_6d8[1] = 0.6;
  local_6d8[2] = 0.0;
  local_6d8[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_6c8,&local_858);
  local_6b8._0_4_ = -0.6;
  local_6b8._4_4_ = -1.2;
  local_6b8._8_4_ = 0.0;
  local_6b8._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x10),&local_868);
  local_6b8._32_4_ = -1.2;
  local_6b8._36_4_ = -0.6;
  local_6b8._40_4_ = 0.0;
  local_6b8._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x30),&local_848);
  local_678[0] = -0.6;
  local_678[1] = -0.6;
  local_678[2] = 0.0;
  local_678[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_668,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_3",
             (char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_3_viewport_center",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_3_viewport_corner",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = 0.3;
  local_838.p0.m_data[1] = 0.2;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = 0.3;
  local_838.p1.m_data[1] = -0.2;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = 0.9;
  local_838.p2.m_data[1] = 0.0;
  local_838.p2.m_data[2] = 2.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0xbf99999a3f19999a;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,&local_868);
  local_7b8 = 0xbf19999a3f99999a;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,&local_848);
  local_798 = 0xbf19999a3f19999a;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,&local_858);
  local_778 = 0x3f99999a3f19999a;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_868);
  local_758 = 0x3f19999a3f99999a;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_848);
  local_738 = 0x3f19999a3f19999a;
  uStack_730 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_728,&local_858);
  local_718._0_4_ = -0.6;
  local_718._4_4_ = 1.2;
  local_718._8_4_ = 0.0;
  local_718._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x10),&local_868);
  local_718._32_4_ = -1.2;
  local_718._36_4_ = 0.6;
  local_718._40_4_ = 0.0;
  local_718._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x30),&local_848);
  local_6d8[0] = -0.6;
  local_6d8[1] = 0.6;
  local_6d8[2] = 0.0;
  local_6d8[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_6c8,&local_858);
  local_6b8._0_4_ = -0.6;
  local_6b8._4_4_ = -1.2;
  local_6b8._8_4_ = 0.0;
  local_6b8._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x10),&local_868);
  local_6b8._32_4_ = -1.2;
  local_6b8._36_4_ = -0.6;
  local_6b8._40_4_ = 0.0;
  local_6b8._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x30),&local_848);
  local_678[0] = -0.6;
  local_678[1] = -0.6;
  local_678[2] = 0.0;
  local_678[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_668,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_4",
             (char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_4_viewport_center",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_4_viewport_corner",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = -0.3;
  local_838.p0.m_data[1] = 0.2;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = -0.3;
  local_838.p1.m_data[1] = -0.2;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = -0.9;
  local_838.p2.m_data[1] = 0.0;
  local_838.p2.m_data[2] = 2.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0xbf99999a3f19999a;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,&local_868);
  local_7b8 = 0xbf19999a3f99999a;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,&local_848);
  local_798 = 0xbf19999a3f19999a;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,&local_858);
  local_778 = 0x3f99999a3f19999a;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_868);
  local_758 = 0x3f19999a3f99999a;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_848);
  local_738 = 0x3f19999a3f19999a;
  uStack_730 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_728,&local_858);
  local_718._0_4_ = -0.6;
  local_718._4_4_ = 1.2;
  local_718._8_4_ = 0.0;
  local_718._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x10),&local_868);
  local_718._32_4_ = -1.2;
  local_718._36_4_ = 0.6;
  local_718._40_4_ = 0.0;
  local_718._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x30),&local_848);
  local_6d8[0] = -0.6;
  local_6d8[1] = 0.6;
  local_6d8[2] = 0.0;
  local_6d8[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_6c8,&local_858);
  local_6b8._0_4_ = -0.6;
  local_6b8._4_4_ = -1.2;
  local_6b8._8_4_ = 0.0;
  local_6b8._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x10),&local_868);
  local_6b8._32_4_ = -1.2;
  local_6b8._36_4_ = -0.6;
  local_6b8._40_4_ = 0.0;
  local_6b8._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x30),&local_848);
  local_678[0] = -0.6;
  local_678[1] = -0.6;
  local_678[2] = 0.0;
  local_678[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_668,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_5",
             (char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_5_viewport_center",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_5_viewport_corner",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = -0.2;
  local_838.p0.m_data[1] = 0.3;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = 0.2;
  local_838.p1.m_data[1] = 0.3;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = 0.0;
  local_838.p2.m_data[1] = 0.9;
  local_838.p2.m_data[2] = 2.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0xbf99999a3f19999a;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,&local_868);
  local_7b8 = 0xbf19999a3f99999a;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,&local_848);
  local_798 = 0xbf19999a3f19999a;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,&local_858);
  local_778 = 0x3f99999a3f19999a;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_868);
  local_758 = 0x3f19999a3f99999a;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_848);
  local_738 = 0x3f19999a3f19999a;
  uStack_730 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_728,&local_858);
  local_718._0_4_ = -0.6;
  local_718._4_4_ = 1.2;
  local_718._8_4_ = 0.0;
  local_718._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x10),&local_868);
  local_718._32_4_ = -1.2;
  local_718._36_4_ = 0.6;
  local_718._40_4_ = 0.0;
  local_718._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x30),&local_848);
  local_6d8[0] = -0.6;
  local_6d8[1] = 0.6;
  local_6d8[2] = 0.0;
  local_6d8[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_6c8,&local_858);
  local_6b8._0_4_ = -0.6;
  local_6b8._4_4_ = -1.2;
  local_6b8._8_4_ = 0.0;
  local_6b8._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x10),&local_868);
  local_6b8._32_4_ = -1.2;
  local_6b8._36_4_ = -0.6;
  local_6b8._40_4_ = 0.0;
  local_6b8._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x30),&local_848);
  local_678[0] = -0.6;
  local_678[1] = -0.6;
  local_678[2] = 0.0;
  local_678[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_668,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_6",
             (char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_6_viewport_center",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_6_viewport_corner",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = 0.6;
  local_838.p0.m_data[1] = 1.2;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = 1.2;
  local_838.p1.m_data[1] = 0.6;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = 0.6;
  local_838.p2.m_data[1] = 0.6;
  local_838.p2.m_data[2] = 0.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0xbf99999a3f19999a;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,&local_868);
  local_7b8 = 0xbf19999a3f99999a;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,&local_848);
  local_798 = 0xbf19999a3f19999a;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,&local_858);
  local_778 = 0x3f99999a3f19999a;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_868);
  local_758 = 0x3f19999a3f99999a;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_848);
  local_738 = 0x3f19999a3f19999a;
  uStack_730 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_728,&local_858);
  local_718._0_4_ = -0.6;
  local_718._4_4_ = 1.2;
  local_718._8_4_ = 0.0;
  local_718._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x10),&local_868);
  local_718._32_4_ = -1.2;
  local_718._36_4_ = 0.6;
  local_718._40_4_ = 0.0;
  local_718._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x30),&local_848);
  local_6d8[0] = -0.6;
  local_6d8[1] = 0.6;
  local_6d8[2] = 0.0;
  local_6d8[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_6c8,&local_858);
  local_6b8._0_4_ = -0.6;
  local_6b8._4_4_ = -1.2;
  local_6b8._8_4_ = 0.0;
  local_6b8._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x10),&local_868);
  local_6b8._32_4_ = -1.2;
  local_6b8._36_4_ = -0.6;
  local_6b8._40_4_ = 0.0;
  local_6b8._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x30),&local_848);
  local_678[0] = -0.6;
  local_678[1] = -0.6;
  local_678[2] = 0.0;
  local_678[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_668,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_7",
             (char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_7_viewport_center",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_7_viewport_corner",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = -0.2;
  local_838.p0.m_data[1] = -0.3;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = 0.2;
  local_838.p1.m_data[1] = -0.3;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = 0.0;
  local_838.p2.m_data[1] = -0.9;
  local_838.p2.m_data[2] = 2.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0xbf800000bf800000;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,(Vector<float,_4> *)local_598);
  local_7b8 = 0xbf8000003f800000;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,(Vector<float,_4> *)local_598);
  local_798 = 0x3f800000bf800000;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,(Vector<float,_4> *)local_598);
  local_778 = 0x3f800000bf800000;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_858);
  local_758 = 0xbf8000003f800000;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_858);
  local_738 = 0x3f8000003f800000;
  uStack_730 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_728,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_8",
             (char *)&local_838,(TriangleData *)local_718,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_8_viewport_center",(char *)&local_838,(TriangleData *)local_718,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_8_viewport_corner",(char *)&local_838,(TriangleData *)local_718,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = -0.2;
  local_838.p0.m_data[1] = -0.3;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = 0.2;
  local_838.p1.m_data[1] = -0.3;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = 0.0;
  local_838.p2.m_data[1] = -0.9;
  local_838.p2.m_data[2] = 2.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0x3f800000bf800000;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,&local_868);
  local_7b8 = 0xbf8000003f800000;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,&local_868);
  local_798 = 0x3f8000003f800000;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,&local_868);
  local_778 = 0xbf800000bf800000;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_858);
  local_758 = 0xbf8000003f800000;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_858);
  local_738 = 0x3f800000bf800000;
  uStack_730 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_728,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_9",
             (char *)&local_838,(TriangleData *)local_718,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_9_viewport_center",(char *)&local_838,(TriangleData *)local_718,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_9_viewport_corner",(char *)&local_838,(TriangleData *)local_718,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = -0.2;
  local_838.p0.m_data[1] = -0.3;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = 0.2;
  local_838.p1.m_data[1] = -0.3;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = 0.0;
  local_838.p2.m_data[1] = -0.9;
  local_838.p2.m_data[2] = 2.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0xbf800000bf800000;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,(Vector<float,_4> *)local_598);
  local_7b8 = 0xbf8000003f800000;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,(Vector<float,_4> *)local_598);
  local_798 = 0x3f800000bf800000;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,(Vector<float,_4> *)local_598);
  local_778 = 0x3f800000bf800000;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_868);
  local_758 = 0xbf8000003f800000;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_868);
  local_738 = 0x3f8000003f800000;
  uStack_730 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_728,&local_868);
  local_718._0_4_ = -1.0;
  local_718._4_4_ = -1.0;
  local_718._8_4_ = 0.0;
  local_718._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x10),&local_858);
  local_718._32_4_ = 1.0;
  local_718._36_4_ = -1.0;
  local_718._40_4_ = 0.0;
  local_718._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x30),&local_858);
  local_6d8[0] = -1.0;
  local_6d8[1] = 1.0;
  local_6d8[2] = 0.0;
  local_6d8[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_6c8,&local_858);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_10",
             (char *)&local_838,(TriangleData *)local_6b8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_10_viewport_center",(char *)&local_838,(TriangleData *)local_6b8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_10_viewport_corner",(char *)&local_838,(TriangleData *)local_6b8,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_838.p0.m_data[0] = -0.2;
  local_838.p0.m_data[1] = -0.3;
  local_838.p0.m_data[2] = 0.0;
  local_838.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c0,&local_868);
  local_838.p1.m_data[0] = 0.2;
  local_838.p1.m_data[1] = -0.3;
  local_838.p1.m_data[2] = 0.0;
  local_838.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c1,&local_848);
  local_838.p2.m_data[0] = 0.0;
  local_838.p2.m_data[1] = -0.9;
  local_838.p2.m_data[2] = 2.0;
  local_838.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_838.c2,&local_858);
  local_7d8 = 0xbf800000bf800000;
  uStack_7d0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7c8,(Vector<float,_4> *)local_598);
  local_7b8 = 0xbf8000003f800000;
  uStack_7b0 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_7a8,(Vector<float,_4> *)local_598);
  local_798 = 0x3f800000bf800000;
  uStack_790 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_788,(Vector<float,_4> *)local_598);
  local_778 = 0x3f800000bf800000;
  uStack_770 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_768,&local_868);
  local_758 = 0xbf8000003f800000;
  uStack_750 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_748,&local_868);
  local_738 = 0x3f8000003f800000;
  uStack_730 = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_728,&local_868);
  local_718._0_4_ = -1.0;
  local_718._4_4_ = -1.0;
  local_718._8_4_ = 0.0;
  local_718._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x10),&local_858);
  local_718._32_4_ = 1.0;
  local_718._36_4_ = -1.0;
  local_718._40_4_ = 0.0;
  local_718._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_718 + 0x30),&local_858);
  local_6d8[0] = -1.0;
  local_6d8[1] = 1.0;
  local_6d8[2] = 0.0;
  local_6d8[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_6c8,&local_858);
  local_6b8._0_4_ = -1.0;
  local_6b8._4_4_ = 1.0;
  local_6b8._8_4_ = 0.0;
  local_6b8._12_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x10),&local_848);
  local_6b8._32_4_ = 1.0;
  local_6b8._36_4_ = -1.0;
  local_6b8._40_4_ = 0.0;
  local_6b8._44_4_ = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_6b8 + 0x30),&local_848);
  local_678[0] = 1.0;
  local_678[1] = 1.0;
  local_678[2] = 0.0;
  local_678[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_668,&local_848);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"multiple_11",
             (char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_11_viewport_center",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "multiple_11_viewport_corner",(char *)&local_838,(TriangleData *)local_658,
             (TriangleData *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,
             (WindowRectangle *)viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void PolysTestGroup::init (void)
{
	const float		large = 100000.0f;
	const float		offset = 0.9f;
	const tcu::Vec4 white	(1.0f, 1.0f, 1.0f, 1.0f);
	const tcu::Vec4 red		(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 yellow	(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue	(0.0f, 0.0f, 1.0f, 1.0f);

	// basic cases
	{
		const TriangleCase::TriangleData viewportPolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.8f, -0.2f,  0.0f,  1.0f), white, tcu::Vec4(-0.8f,  0.2f,  0.0f,  1.0f), white, tcu::Vec4(-1.3f,  0.05f,  0.0f,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), white, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), white, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-1.1f,  0.6f,  0.0f,  1.0f), white, tcu::Vec4(-1.1f,  1.1f,  0.0f,  1.0f), white, tcu::Vec4(-0.6f,  1.1f,  0.0f,  1.0f), white},
			{tcu::Vec4( 0.8f,  1.1f,  0.0f,  1.0f), white, tcu::Vec4( 0.95f,-1.1f,  0.0f,  1.0f), white, tcu::Vec4( 3.0f,  0.0f,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData depthPolys[] =
		{
			// one vertex clipped to Z+
			{tcu::Vec4(-0.2f,  0.7f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f,  0.7f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f,  0.9f,  2.0f,  1.0f), white},

			// two vertices clipped to Z-
			{tcu::Vec4( 0.9f, 0.4f,  -1.5f,  1.0f), white, tcu::Vec4( 0.9f, -0.4f, -1.5f,  1.0f), white, tcu::Vec4( 0.6f,  0.0f,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, 0.6f,  -2.0f,  1.0f), white, tcu::Vec4(-0.9f, -0.6f, -2.0f,  1.0f), white, tcu::Vec4(-0.4f,  0.0f,  2.0f,  1.0f), white},

			// three vertices clipped by X, Y and Z
			{tcu::Vec4( 0.0f, -1.2f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f,  0.5f,  -1.5f, 1.0f), white, tcu::Vec4( 1.2f, -0.9f,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData largePolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f, -large,  2.0f,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4( 0.5f, 0.5f,  0.0f,  1.0f), white, tcu::Vec4( large, 0.5f, 0.0f,  1.0f), white, tcu::Vec4( 0.5f,  large,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, -large, 0.0f,  1.0f), white, tcu::Vec4(-1.1f, -large, 0.0f,  1.0f), white, tcu::Vec4(-0.9f,  large,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData largeDepthPolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f, -large, large,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4( 0.5f, 0.5f,  0.0f,  1.0f), white, tcu::Vec4( 0.9f, large/2, -large,  1.0f), white, tcu::Vec4( large/4, 0.0f, -large,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, large/4, large,  1.0f), white, tcu::Vec4(-0.5f, -large/4, -large,  1.0f), white, tcu::Vec4(-0.2f, large/4, large,  1.0f), white},
		};
		const TriangleCase::TriangleData attribPolys[] =
		{
			// one vertex clipped to edge, large
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -large,  2.0f,  1.0f), blue},

			// two vertices clipped to edges
			{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

			// two vertices clipped to edges, with non-uniform w
			{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},

			// three vertices clipped, large, Z
			{tcu::Vec4(-0.9f, large/4, large,  1.0f), red, tcu::Vec4(-0.5f, -large/4, -large,  1.0f), yellow, tcu::Vec4(-0.2f, large/4, large,  1.0f), blue},
		};

		addChild(new TriangleCase(m_context, "poly_clip_viewport_center",			"polygon viewport clipping",	DE_ARRAY_BEGIN(viewportPolys),		DE_ARRAY_END(viewportPolys),	VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "poly_clip_viewport_corner",			"polygon viewport clipping",	DE_ARRAY_BEGIN(viewportPolys),		DE_ARRAY_END(viewportPolys),	VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "poly_z_clip",							"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_WHOLE));
		addChild(new TriangleCase(m_context, "poly_z_clip_viewport_center",			"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "poly_z_clip_viewport_corner",			"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "large_poly_clip_viewport_center",		"polygon viewport clipping",	DE_ARRAY_BEGIN(largePolys),			DE_ARRAY_END(largePolys),		VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "large_poly_clip_viewport_corner",		"polygon viewport clipping",	DE_ARRAY_BEGIN(largePolys),			DE_ARRAY_END(largePolys),		VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "large_poly_z_clip",					"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_WHOLE));
		addChild(new TriangleCase(m_context, "large_poly_z_clip_viewport_center",	"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "large_poly_z_clip_viewport_corner",	"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_CORNER));

		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip",					"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_WHOLE));
		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_CENTER));
		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_CORNER));
	}

	// multiple polygons
	{
		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to edge
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges, with non-uniform w
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},

				// three vertices clipped, Z
				{tcu::Vec4(-0.9f, offset/4, offset,  1.0f), red, tcu::Vec4(-0.5f, -offset/4, -offset,  1.0f), yellow, tcu::Vec4(-0.2f, offset/4, offset,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_0",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_0_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_0_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges, with non-uniform w
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_1",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_1_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_1_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_2",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_2_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_2_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset, -2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_3",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_3_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_3_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(0.3f,  0.2f,  0.0f,  1.0f), red, tcu::Vec4( 0.3f, -0.2f,  0.0f,  1.0f), yellow, tcu::Vec4( offset, 0.0f,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_4",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_4_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_4_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.3f,  0.2f,  0.0f,  1.0f), red, tcu::Vec4(-0.3f, -0.2f,  0.0f,  1.0f), yellow, tcu::Vec4(-offset, 0.0f,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_5",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_5_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_5_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, 0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_6",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_6_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_6_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_7",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_7_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_7_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), blue,	tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_8",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_8_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_8_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,  tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_9",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_9_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_9_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,   tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,   tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue,  tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_10",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_10_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_10_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white,  tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,    tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,    tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue,   tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue,   tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), yellow, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), yellow, tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), yellow},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_11",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_11_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_11_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}
	}
}